

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::DistExpression>
          (ConstraintExprVisitor *this,DistExpression *expr)

{
  ExpressionKind EVar1;
  uint uVar2;
  int iVar3;
  Expression *pEVar4;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  RandMode RVar11;
  SubroutineKind SVar12;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar13;
  SourceLocation SVar14;
  long lVar16;
  DiagCode code;
  ASTContext *this_00;
  BinaryExpression *binExpr;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  byte local_2b;
  SourceLocation SVar15;
  
  if ((this->failed != false) || (bVar9 = Expression::bad(&expr->super_Expression), bVar9))
  goto LAB_0039a757;
  symbol = Expression::getSymbolReference(&expr->super_Expression,true);
  if (symbol != (Symbol *)0x0) {
    RVar11 = ASTContext::getRandMode(this->context,symbol);
    if (RVar11 != None) {
      this->sawRandVars = true;
    }
    if ((RVar11 == RandC) && (this->isSoft != false)) {
      ASTContext::addDiag(this->context,(DiagCode)0x390008,(expr->super_Expression).sourceRange);
    }
  }
  EVar1 = (expr->super_Expression).kind;
  if ((EVar1 < Conversion) && ((0x340000U >> (EVar1 & ValueRange) & 1) != 0)) {
    cVar10 = '\0';
  }
  else {
    bVar9 = this->isTop;
    bVar8 = this->sawRandVars;
    this->isTop = false;
    this->sawRandVars = false;
    DistExpression::visitExprs<slang::ast::ConstraintExprVisitor&>(expr,this);
    cVar10 = this->sawRandVars;
    this->isTop = bVar9;
    this->sawRandVars = bVar8;
  }
  EVar1 = (expr->super_Expression).kind;
  switch(EVar1) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_38,(SVIntStorage *)&expr->items_);
    goto LAB_0039a61c;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    if (0 < (int)(((this_00->scope).ptr)->compilation->options).languageVersion) break;
    SVar15 = (expr->super_Expression).sourceRange.startLoc;
    SVar14 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_0039a559;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_38);
LAB_0039a61c:
    if ((0x40 < local_30 || (local_2b & 1) != 0) && ((void *)local_38.val != (void *)0x0)) {
      operator_delete__(local_38.pVal);
    }
    if ((local_2b & 1) == 0) {
      return true;
    }
    this_00 = this->context;
    SVar15 = (expr->super_Expression).sourceRange.startLoc;
    SVar14 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_0039a559;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    uVar2 = (uint)(expr->items_)._M_extent._M_extent_value;
    if (uVar2 < 0x17) {
      if ((0x79e600U >> (uVar2 & 0x1f) & 1) == 0) {
        if ((0x61800U >> (uVar2 & 0x1f) & 1) != 0) goto switchD_0039a509_caseD_11;
      }
      else if ((cVar10 != '\0') &&
              ((((expr->left_->kind & ~IntegerLiteral) == NamedValue &&
                (bVar9 = checkType(this,expr->left_), !bVar9)) ||
               ((pEVar4 = (Expression *)(expr->items_)._M_ptr,
                (pEVar4->kind & ~IntegerLiteral) == NamedValue &&
                (bVar9 = checkType(this,pEVar4), !bVar9)))))) goto LAB_0039a757;
    }
    break;
  case Streaming:
switchD_0039a509_caseD_11:
    this_00 = this->context;
    SVar15 = (expr->super_Expression).sourceRange.startLoc;
    SVar14 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_0039a559:
    sourceRange.endLoc = SVar14;
    sourceRange.startLoc = SVar15;
    ASTContext::addDiag(this_00,code,sourceRange);
    goto LAB_0039a757;
  case Call:
    SVar12 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar12 == Task) {
      this_00 = this->context;
      SVar15 = (expr->super_Expression).sourceRange.startLoc;
      SVar14 = (expr->super_Expression).sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_0039a559;
    }
    if ((char)expr[1].super_Expression.kind != IntegerLiteral) {
      ppSVar13 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&expr->left_);
      pSVar5 = *ppSVar13;
      if ((pSVar5->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar5->super_Scope);
      }
      sVar6 = (pSVar5->arguments)._M_extent._M_extent_value;
      bVar9 = sVar6 == 0;
      if (!bVar9) {
        lVar16 = 0;
        do {
          lVar7 = *(long *)((long)(pSVar5->arguments)._M_ptr + lVar16);
          iVar3 = *(int *)(lVar7 + 0x158);
          if (iVar3 == 3) {
            if ((*(byte *)(lVar7 + 0x154) & 1) == 0) goto LAB_0039a729;
          }
          else if (iVar3 - 1U < 2) {
LAB_0039a729:
            ASTContext::addDiag(this->context,(DiagCode)0x320008,
                                (expr->super_Expression).sourceRange);
            this->failed = true;
            break;
          }
          lVar16 = lVar16 + 8;
          bVar9 = sVar6 << 3 == lVar16;
        } while (!bVar9);
      }
      if (!bVar9) {
        return false;
      }
    }
    break;
  default:
    switch(EVar1) {
    case ValueRange:
      return true;
    case Dist:
      local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_30 = local_30 & 0xffffff00;
      pEVar4 = expr->left_;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (pEVar4,pEVar4,(DistVarVisitor *)&local_38);
      if ((char)local_30 == '\0') {
        ASTContext::addDiag(this->context,(DiagCode)0x3c0008,pEVar4->sourceRange);
        return true;
      }
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_0039a509_caseD_11;
    }
  }
  bVar9 = checkType(this,&expr->super_Expression);
  if (bVar9) {
    return true;
  }
LAB_0039a757:
  this->failed = true;
  return false;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }